

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_msh2(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  REF_CELL ref_cell;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  REF_CELL_TYPE RVar8;
  FILE *__stream;
  void *__s;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint local_bc;
  uint local_a8 [4];
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  long local_38;
  
  pRVar1 = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar12 = "unable to open file";
    uVar11 = 0x950;
  }
  else {
    fprintf(__stream,"$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n",0x400199999999999a,0);
    iVar13 = pRVar1->max;
    lVar16 = (long)iVar13;
    if (lVar16 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x955,"ref_export_msh2","malloc o2n of REF_INT negative");
      return 1;
    }
    __s = malloc(lVar16 * 4);
    if (__s != (void *)0x0) {
      if (iVar13 == 0) {
        fprintf(__stream,"$Nodes\n%d\n",0);
      }
      else {
        memset(__s,0xff,lVar16 * 4);
        pRVar2 = pRVar1->global;
        lVar9 = 0;
        uVar10 = 0;
        do {
          if (-1 < pRVar2[lVar9]) {
            *(int *)((long)__s + (long)(int)uVar10 * 4) = (int)lVar9;
            uVar10 = (ulong)((int)uVar10 + 1);
          }
          lVar9 = lVar9 + 1;
        } while (lVar16 != lVar9);
        fprintf(__stream,"$Nodes\n%d\n",uVar10);
        if (0 < (int)uVar10) {
          uVar15 = 0;
          do {
            pRVar3 = pRVar1->real;
            lVar16 = (long)*(int *)((long)__s + uVar15 * 4);
            uVar15 = uVar15 + 1;
            fprintf(__stream,"%d %.16E %.16E %.16E\n",pRVar3[lVar16 * 0xf],pRVar3[lVar16 * 0xf + 1],
                    pRVar3[lVar16 * 0xf + 2],uVar15 & 0xffffffff);
          } while (uVar10 != uVar15);
        }
      }
      fwrite("$EndNodes\n",10,1,__stream);
      lVar16 = 0;
      uVar10 = 0;
      do {
        iVar13 = ref_grid->cell[lVar16]->n;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        uVar10 = (ulong)(uint)((int)uVar10 + iVar13);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x10);
      fprintf(__stream,"$Elements\n%d\n",uVar10);
      lVar16 = 0;
      uVar14 = 0;
      do {
        ref_cell = ref_grid->cell[lVar16];
        local_38 = lVar16;
        if (0 < ref_cell->n) {
          switch(ref_cell->type) {
          case REF_CELL_EDG:
            local_bc = 1;
            break;
          case REF_CELL_ED2:
            local_bc = 8;
            break;
          case REF_CELL_ED3:
            local_bc = 0x1a;
            break;
          case REF_CELL_TRI:
            local_bc = 2;
            break;
          case REF_CELL_TR2:
            local_bc = 9;
            break;
          case REF_CELL_TR3:
            local_bc = 0x15;
            break;
          case REF_CELL_QUA:
            local_bc = 3;
            break;
          case REF_CELL_QU2:
          case REF_CELL_PY2:
          case REF_CELL_PR2:
          case REF_CELL_HE2:
            return 6;
          case REF_CELL_TET:
            local_bc = 4;
            break;
          case REF_CELL_PYR:
            local_bc = 7;
            break;
          case REF_CELL_PRI:
            local_bc = 6;
            break;
          case REF_CELL_HEX:
            local_bc = 5;
            break;
          case REF_CELL_TE2:
            local_bc = 0xb;
            break;
          default:
            local_bc = 0xffffffff;
          }
          if (0 < ref_cell->max) {
            iVar13 = 0;
            do {
              RVar7 = ref_cell_nodes(ref_cell,iVar13,(REF_INT *)local_a8);
              uVar4 = local_a8[0];
              if (RVar7 == 0) {
                RVar8 = ref_cell->type;
                if (RVar8 == REF_CELL_PYR) {
                  uVar17 = local_a8[1];
                  uVar18 = local_a8[2];
                  local_a8[1] = local_a8[3];
                  local_a8[2] = uStack_98;
                  RVar8 = ref_cell->type;
                  local_a8[3] = uVar17;
                  uStack_98 = uVar18;
                }
                uVar6 = uStack_98;
                uVar18 = local_a8[3];
                uVar17 = local_a8[1];
                if (RVar8 == REF_CELL_TE2) {
                  RVar8 = ref_cell->type;
                }
                if (RVar8 == REF_CELL_TRI) {
                  local_a8[0] = local_a8[2];
                  local_a8[2] = uVar4;
                  RVar8 = ref_cell->type;
                }
                uVar5 = local_a8[2];
                uVar4 = local_a8[0];
                local_a8[0] = uVar4;
                local_a8[2] = uVar5;
                if (RVar8 == REF_CELL_TR2) {
                  local_a8[0] = local_a8[2];
                  local_a8[2] = uVar4;
                  local_a8[3] = uStack_98;
                  uStack_98 = uVar18;
                  RVar8 = ref_cell->type;
                  if (RVar8 == REF_CELL_TR2) {
                    local_a8[3] = uStack_90;
                    uStack_98 = uStack_94;
                    uStack_94 = uVar6;
                    uStack_90 = uVar18;
                    RVar8 = ref_cell->type;
                    local_a8[0] = uVar4;
                    local_a8[2] = uVar5;
                  }
                }
                uVar4 = local_a8[0];
                if (RVar8 == REF_CELL_QUA) {
                  local_a8[0] = local_a8[1];
                  local_a8[1] = local_a8[2];
                  local_a8[2] = uVar17;
                  local_a8[3] = uVar4;
                }
                uVar14 = uVar14 + 1;
                fprintf(__stream,"%d %d %d",(ulong)uVar14,(ulong)local_bc,2);
                if (ref_cell->last_node_is_an_id == 0) {
                  uVar15 = 0;
                  uVar10 = 0;
                }
                else {
                  uVar10 = (ulong)local_a8[ref_cell->node_per];
                  uVar15 = (ulong)local_a8[ref_cell->node_per];
                }
                fprintf(__stream," %d %d",uVar15,uVar10);
                if (0 < ref_cell->node_per) {
                  lVar16 = 0;
                  do {
                    fprintf(__stream," %d",(ulong)(local_a8[lVar16] + 1));
                    lVar16 = lVar16 + 1;
                  } while (lVar16 < ref_cell->node_per);
                }
                fputc(10,__stream);
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < ref_cell->max);
          }
        }
        lVar16 = local_38 + 1;
      } while (lVar16 != 0x10);
      fwrite("$EndElements\n",0xd,1,__stream);
      free(__s);
      fclose(__stream);
      return 0;
    }
    pcVar12 = "malloc n2o of REF_INT NULL";
    uVar11 = 0x956;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar11,
         "ref_export_msh2",pcVar12);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_msh2(REF_GRID ref_grid,
                                          const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, nnode;
  REF_INT *o2n, *n2o;
  REF_INT group;
  REF_INT ncell;
  REF_INT type, ntag;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell_node;

  double version = 2.2;
  int filetype =
      0; /* file-type(ASCII int; 0 for ASCII mode, 1 for binary mode) */
  int datasize = 8; /* data-size(ASCII int; sizeof(size_t)) */

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "$MeshFormat\n%3.1f %d %d\n$EndMeshFormat\n", version, filetype,
          datasize);

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }
  fprintf(f, "$Nodes\n%d\n", nnode);
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%d %.16E %.16E %.16E\n", node + 1,
            ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }
  fprintf(f, "$EndNodes\n");

  ncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      ncell += ref_cell_n(ref_cell);
    }
  }

  fprintf(f, "$Elements\n%d\n", ncell);
  ncell = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell)) {
      type = REF_EMPTY;
      switch (ref_cell_type(ref_cell)) {
        case REF_CELL_EDG:
          type = 1;
          break;
        case REF_CELL_ED2:
          type = 8;
          break;
        case REF_CELL_ED3:
          type = 26;
          break;
        case REF_CELL_TRI:
          type = 2;
          break;
        case REF_CELL_TR2:
          type = 9;
          break;
        case REF_CELL_TR3:
          type = 21;
          break;
        case REF_CELL_QUA:
          type = 3;
          break;
        case REF_CELL_TET:
          type = 4;
          break;
        case REF_CELL_TE2:
          type = 11;
          break;
        case REF_CELL_PYR:
          type = 7;
          break;
        case REF_CELL_PRI:
          type = 6;
          break;
        case REF_CELL_HEX:
          type = 5;
          break;
        case REF_CELL_QU2:
        case REF_CELL_PY2:
        case REF_CELL_PR2:
        case REF_CELL_HE2:
          return REF_IMPLEMENT;
      }
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) { /* on side */
          REF_INT n0, n1, n2, n3, n4;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          nodes[0] = n0;
          nodes[3] = n1;
          nodes[4] = n2;
          nodes[1] = n3;
          nodes[2] = n4;
        }
        if (REF_CELL_TE2 == ref_cell_type(ref_cell)) { /* swap 8-9 */
          REF_INT n9;
          n9 = nodes[9];
          nodes[9] = nodes[8];
          nodes[8] = n9;
        }
        if (REF_CELL_TRI == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n4;
          nodes[4] = n3;
          nodes[5] = n5;
        }
        if (REF_CELL_TR2 == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3, n4, n5, n6, n7, n8, n9;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          n5 = nodes[5];
          n6 = nodes[6];
          n7 = nodes[7];
          n8 = nodes[8];
          n9 = nodes[9];
          nodes[0] = n2;
          nodes[1] = n1;
          nodes[2] = n0;
          nodes[3] = n6;
          nodes[4] = n5;
          nodes[5] = n3;
          nodes[6] = n4;
          nodes[7] = n8;
          nodes[8] = n7;
          nodes[9] = n9;
        }
        if (REF_CELL_QUA == ref_cell_type(ref_cell)) { /* outward normal */
          REF_INT n0, n1, n2, n3;
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          nodes[0] = n3;
          nodes[1] = n2;
          nodes[2] = n1;
          nodes[3] = n0;
        }
        ntag = 2;
        fprintf(f, "%d %d %d", ncell + 1, type, ntag);
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          fprintf(f, " %d %d", nodes[ref_cell_id_index(ref_cell)],
                  nodes[ref_cell_id_index(ref_cell)]);
        } else {
          fprintf(f, " %d %d", 0, 0);
        }
        each_ref_cell_cell_node(ref_cell, cell_node) {
          fprintf(f, " %d", nodes[cell_node] + 1);
        }
        fprintf(f, "\n");
        ncell++;
      }
    }
  }
  fprintf(f, "$EndElements\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}